

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

BOOL lists_equal(List *l1,List *l2)

{
  BOOL BVar1;
  
  while( true ) {
    if (l1 == l2) {
      return TRUE;
    }
    if (l1 == (List *)0x0) {
      return FALSE;
    }
    if (l2 == (List *)0x0) {
      return FALSE;
    }
    BVar1 = tokens_equal(&l1->token,&l2->token);
    if (BVar1 == FALSE) break;
    BVar1 = lists_equal(l1->car,l2->car);
    if (BVar1 == FALSE) {
      return FALSE;
    }
    l1 = l1->cdr;
    l2 = l2->cdr;
  }
  return FALSE;
}

Assistant:

BOOL
lists_equal (const List *l1, const List *l2)
{
  if (l1 == l2)   /* Handles NULL == NULL case. */
    return TRUE;
  if (l1 == NULL || l2 == NULL)
    return FALSE;
  if (!tokens_equal (&l1->token, &l2->token))
    return FALSE;
  return lists_equal (l1->car, l2->car) && lists_equal (l1->cdr, l2->cdr);
}